

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::anon_unknown_0::SanitizeNameForObjC
                   (string *__return_storage_ptr__,string_view prefix,string_view input,
                   string_view extension,string *out_suffix_added)

{
  string_view pc;
  string_view pc_00;
  string_view pc_01;
  string_view pc_02;
  string_view prefix_00;
  string_view text;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  uchar *puVar4;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *prVar5;
  char *pcVar6;
  string_view input_00;
  AlphaNum local_290;
  AlphaNum local_260;
  allocator<char> local_229;
  string local_228 [32];
  undefined1 local_208 [16];
  string *local_1f8;
  size_t sStack_1f0;
  AlphaNum local_1e8;
  char *local_1b8;
  char *pcStack_1b0;
  AlphaNum local_1a0;
  AlphaNum local_170;
  string *local_128;
  size_t sStack_120;
  AlphaNum local_118;
  char *local_e8;
  char *pcStack_e0;
  AlphaNum local_d8;
  AlphaNum local_a8;
  char *local_78;
  char *local_70;
  string *local_68;
  size_t local_60;
  undefined1 local_58 [8];
  string sanitized;
  string *out_suffix_added_local;
  string_view input_local;
  string_view prefix_local;
  
  input_local._M_len = (size_t)input._M_str;
  out_suffix_added_local = (string *)input._M_len;
  pcVar6 = prefix._M_str;
  input_local._M_str = (char *)prefix._M_len;
  sanitized.field_2._8_8_ = out_suffix_added;
  std::__cxx11::string::string((string *)local_58);
  local_68 = out_suffix_added_local;
  local_60 = input_local._M_len;
  local_78 = input_local._M_str;
  text._M_str = (char *)input_local._M_len;
  text._M_len = (size_t)out_suffix_added_local;
  prefix_00._M_str = pcVar6;
  prefix_00._M_len = (size_t)input_local._M_str;
  local_70 = pcVar6;
  bVar1 = absl::lts_20240722::StartsWith(text,prefix_00);
  if (bVar1) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)&out_suffix_added_local);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)&input_local._M_str);
    if (sVar2 != sVar3) {
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)&input_local._M_str);
      puVar4 = (uchar *)std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                  ((basic_string_view<char,_std::char_traits<char>_> *)
                                   &out_suffix_added_local,sVar2);
      bVar1 = absl::lts_20240722::ascii_isupper(*puVar4);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)(local_170.digits_ + 0x18),
                   (basic_string_view<char,_std::char_traits<char>_> *)&out_suffix_added_local,
                   (allocator<char> *)(local_170.digits_ + 0x17));
        std::__cxx11::string::operator=((string *)local_58,(string *)(local_170.digits_ + 0x18));
        std::__cxx11::string::~string((string *)(local_170.digits_ + 0x18));
        std::allocator<char>::~allocator((allocator<char> *)(local_170.digits_ + 0x17));
        goto LAB_004a1dcd;
      }
    }
    local_e8 = input_local._M_str;
    pc_02._M_str = pcVar6;
    pc_02._M_len = (size_t)input_local._M_str;
    pcStack_e0 = pcVar6;
    absl::lts_20240722::AlphaNum::AlphaNum(&local_d8,pc_02);
    local_128 = out_suffix_added_local;
    sStack_120 = input_local._M_len;
    pc_01._M_str = (char *)input_local._M_len;
    pc_01._M_len = (size_t)out_suffix_added_local;
    absl::lts_20240722::AlphaNum::AlphaNum(&local_118,pc_01);
    absl::lts_20240722::StrCat_abi_cxx11_(&local_a8,&local_d8);
    std::__cxx11::string::operator=((string *)local_58,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  else {
    local_1b8 = input_local._M_str;
    pc_00._M_str = pcVar6;
    pc_00._M_len = (size_t)input_local._M_str;
    pcStack_1b0 = pcVar6;
    absl::lts_20240722::AlphaNum::AlphaNum(&local_1a0,pc_00);
    local_1f8 = out_suffix_added_local;
    sStack_1f0 = input_local._M_len;
    pc._M_str = (char *)input_local._M_len;
    pc._M_len = (size_t)out_suffix_added_local;
    absl::lts_20240722::AlphaNum::AlphaNum(&local_1e8,pc);
    absl::lts_20240722::StrCat_abi_cxx11_(&local_170,&local_1a0);
    std::__cxx11::string::operator=((string *)local_58,(string *)&local_170);
    std::__cxx11::string::~string((string *)&local_170);
  }
LAB_004a1dcd:
  local_208 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
  input_00._M_str = local_208._8_8_;
  input_00._M_len = (size_t)input_00._M_str;
  bVar1 = IsReservedCIdentifier(local_208._0_8_,input_00);
  if (!bVar1) {
    prVar5 = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              *)ReservedWords();
    bVar1 = absl::lts_20240722::container_internal::
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
            ::contains<std::__cxx11::string>
                      (prVar5,(key_arg<std::__cxx11::basic_string<char>_> *)local_58);
    if (!bVar1) {
      prVar5 = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)NSObjectMethods();
      bVar1 = absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::contains<std::__cxx11::string>
                        (prVar5,(key_arg<std::__cxx11::basic_string<char>_> *)local_58);
      if (!bVar1) {
        if (sanitized.field_2._8_8_ != 0) {
          std::__cxx11::string::clear();
        }
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_58);
        goto LAB_004a1f80;
      }
    }
  }
  if (sanitized.field_2._8_8_ != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_228,&extension,&local_229);
    std::__cxx11::string::operator=((string *)sanitized.field_2._8_8_,local_228);
    std::__cxx11::string::~string(local_228);
    std::allocator<char>::~allocator(&local_229);
  }
  absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
            (&local_260,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  absl::lts_20240722::AlphaNum::AlphaNum(&local_290,extension);
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_260);
LAB_004a1f80:
  std::__cxx11::string::~string((string *)local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string SanitizeNameForObjC(absl::string_view prefix,
                                absl::string_view input,
                                absl::string_view extension,
                                std::string* out_suffix_added) {
  std::string sanitized;
  // We add the prefix in the cases where the string is missing a prefix.
  // We define "missing a prefix" as where 'input':
  // a) Doesn't start with the prefix or
  // b) Isn't equivalent to the prefix or
  // c) Has the prefix, but the letter after the prefix is lowercase
  if (absl::StartsWith(input, prefix)) {
    if (input.length() == prefix.length() ||
        !absl::ascii_isupper(input[prefix.length()])) {
      sanitized = absl::StrCat(prefix, input);
    } else {
      sanitized = std::string(input);
    }
  } else {
    sanitized = absl::StrCat(prefix, input);
  }
  if (IsReservedCIdentifier(sanitized) || ReservedWords().contains(sanitized) ||
      NSObjectMethods().contains(sanitized)) {
    if (out_suffix_added) *out_suffix_added = std::string(extension);
    return absl::StrCat(sanitized, extension);
  }
  if (out_suffix_added) out_suffix_added->clear();
  return sanitized;
}